

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void R_DrawFuzzColumnP_C(void)

{
  bool bVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  pBVar2 = NormalLight.Maps;
  if (dc_yl == 0) {
    dc_yl = 1;
  }
  if (fuzzviewheight < dc_yh) {
    dc_yh = fuzzviewheight;
  }
  if (-1 < dc_yh - dc_yl) {
    iVar5 = (dc_yh - dc_yl) + 1;
    pBVar3 = dc_destorg + (long)dc_x + (long)ylookup[dc_yl];
    lVar4 = (long)dc_pitch;
    if ((long)fuzzpos == 0) {
      fuzzpos = 0;
    }
    else {
      iVar8 = 0x32 - fuzzpos;
      iVar7 = iVar5;
      if (iVar8 < iVar5) {
        iVar7 = iVar8;
      }
      if (iVar5 < iVar8) {
        iVar8 = iVar5;
      }
      lVar9 = 0;
      do {
        *pBVar3 = pBVar2[(ulong)pBVar3[fuzzoffset[lVar9 + fuzzpos]] + 0x600];
        pBVar3 = pBVar3 + lVar4;
        lVar9 = lVar9 + 1;
      } while (iVar8 != (int)lVar9);
      iVar5 = iVar5 - iVar7;
      fuzzpos = fuzzpos + (int)lVar9;
    }
    if ((fuzzpos == 0x32) || (0 < iVar5)) {
      iVar7 = iVar5;
      if (0x31 < iVar5) {
        do {
          lVar9 = 0;
          do {
            *pBVar3 = pBVar2[(ulong)pBVar3[*(int *)((long)fuzzoffset + lVar9)] + 0x600];
            pBVar3 = pBVar3 + lVar4;
            lVar9 = lVar9 + 4;
          } while ((int)lVar9 != 200);
          iVar7 = iVar5 + -0x32;
          bVar1 = 99 < iVar5;
          iVar5 = iVar7;
        } while (bVar1);
      }
      if (iVar7 < 1) {
        fuzzpos = 0;
      }
      else {
        piVar6 = fuzzoffset;
        fuzzpos = 0;
        do {
          *pBVar3 = pBVar2[(ulong)pBVar3[*piVar6] + 0x600];
          pBVar3 = pBVar3 + lVar4;
          piVar6 = piVar6 + 1;
          fuzzpos = fuzzpos + 1;
        } while (iVar7 != fuzzpos);
      }
    }
  }
  return;
}

Assistant:

void R_DrawFuzzColumnP_C (void)
{
	int count;
	BYTE *dest;

	// Adjust borders. Low...
	if (dc_yl == 0)
		dc_yl = 1;

	// .. and high.
	if (dc_yh > fuzzviewheight)
		dc_yh = fuzzviewheight;

	count = dc_yh - dc_yl;

	// Zero length.
	if (count < 0)
		return;

	count++;

	dest = ylookup[dc_yl] + dc_x + dc_destorg;

	// colormap #6 is used for shading (of 0-31, a bit brighter than average)
	{
		// [RH] Make local copies of global vars to try and improve
		//		the optimizations made by the compiler.
		int pitch = dc_pitch;
		int fuzz = fuzzpos;
		int cnt;
		BYTE *map = &NormalLight.Maps[6*256];

		// [RH] Split this into three separate loops to minimize
		// the number of times fuzzpos needs to be clamped.
		if (fuzz)
		{
			cnt = MIN(FUZZTABLE-fuzz,count);
			count -= cnt;
			do
			{
				*dest = map[dest[fuzzoffset[fuzz++]]];
				dest += pitch;
			} while (--cnt);
		}
		if (fuzz == FUZZTABLE || count > 0)
		{
			while (count >= FUZZTABLE)
			{
				fuzz = 0;
				cnt = FUZZTABLE;
				count -= FUZZTABLE;
				do
				{
					*dest = map[dest[fuzzoffset[fuzz++]]];
					dest += pitch;
				} while (--cnt);
			}
			fuzz = 0;
			if (count > 0)
			{
				do
				{
					*dest = map[dest[fuzzoffset[fuzz++]]];
					dest += pitch;
				} while (--count);
			}
		}
		fuzzpos = fuzz;
	}
}